

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O0

void formatter_suite::format_array(void)

{
  iterator iVar1;
  iterator iVar2;
  basic_variable<std::allocator<char>_> *data_00;
  basic_variable<std::allocator<char>_> *local_1a0;
  undefined7 local_180;
  undefined1 uStack_179;
  value_type expected [15];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  nullable local_144;
  basic_variable<std::allocator<char>_> *local_140;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_140 = &local_138;
  local_144 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_140,&local_144);
  local_140 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_140,true);
  local_140 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_140,2);
  local_140 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(local_140,3.0);
  local_140 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_140,"ABC");
  local_48._0_8_ = &local_138;
  local_48._8_8_ = 5;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_1a0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_1a0 = local_1a0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1a0);
  } while (local_1a0 != &local_138);
  trial::protocol::bintoken::
  format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 8),
             (bintoken *)local_38,data_00);
  expected[0] = '@';
  expected[1] = 0xa9;
  expected[2] = '\x03';
  expected[3] = 'A';
  expected[4] = 'B';
  expected[5] = 'C';
  expected[6] = 0x93;
  local_180 = 0xc502818292;
  uStack_179 = 0x40;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 8));
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 8));
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0x123,"void formatter_suite::format_array()",iVar1._M_current,iVar2._M_current,
             &local_180,expected + 7);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void format_array()
{
    variable data = { null, true, 2, 3.0f, "ABC" };
    auto result = bintoken::format<buffer_type>(data);
    const value_type expected[] = {
        bintoken::token::code::begin_array,
        bintoken::token::code::null,
        bintoken::token::code::true_value,
        0x02,
        bintoken::token::code::float32, 0x00, 0x00, 0x40, 0x40,
        bintoken::token::code::string8, 0x03, 0x41, 0x42, 0x43,
        bintoken::token::code::end_array
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
}